

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void simpleExpression(item *x)

{
  int iVar1;
  item *x_00;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol == 0x62) {
    getSymbol();
    term(x);
    if (currentSymbol == 0x1f8) {
      mark("negative character ?");
      exit(-1);
    }
    opOne(0x62,x);
  }
  else {
    term(x);
  }
  while ((iVar1 = currentSymbol, currentSymbol - 0x61U < 2 || (currentSymbol == 0xc9))) {
    getSymbol();
    if (iVar1 == 0xc9) {
      opOne(0xc9,x);
      term(x_00);
      opTwo(0xc9,x,x_00);
      iVar1 = x_00->r;
      if (x->r != iVar1) {
        regs[x->r] = 0;
        x->r = iVar1;
      }
    }
    else {
      term(x_00);
      opTwo(iVar1,x,x_00);
    }
  }
  return;
}

Assistant:

procedure
void simpleExpression(struct item *x) {
	variable int op;
	variable struct item *y;
	y = NULL; op = 0;
	allocMem(y);
	if (currentSymbol == SYMBOL_SUB) {
		getSymbol(); term(x);
		if (currentSymbol == SYMBOL_CHARACTERLITERAL) { /* no negative char */
			mark("negative character ?");
			exit(-1);
		} else {
			opOne(SYMBOL_SUB,x);
		}
	} else {
		term(x);
	}
	while ((currentSymbol == SYMBOL_SUB) || (currentSymbol == SYMBOL_ADD) || (currentSymbol == SYMBOL_OR)) {
		op = currentSymbol;
		getSymbol();
		if (op == SYMBOL_OR) {
			opOne(op,x);
		}
		term(y);
		opTwo(op,x,y);
		if (op == SYMBOL_OR) {
			if(x->r != y->r) {
				regs[x->r] = 0;
				x->r = y->r;
			}
		}
	}
}